

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O0

int coda_close(coda_product *product)

{
  int local_1c;
  int i;
  coda_product *product_local;
  
  if (product == (coda_product *)0x0) {
    coda_set_error(-100,"product file argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x306);
    product_local._4_4_ = -1;
  }
  else {
    if (product->product_variable_size != (long *)0x0) {
      free(product->product_variable_size);
      product->product_variable_size = (long *)0x0;
    }
    if (product->product_variable != (int64_t **)0x0) {
      for (local_1c = 0; local_1c < product->product_definition->num_product_variables;
          local_1c = local_1c + 1) {
        if (product->product_variable[local_1c] != (int64_t *)0x0) {
          free(product->product_variable[local_1c]);
        }
      }
      free(product->product_variable);
      product->product_variable = (int64_t **)0x0;
    }
    switch(product->format) {
    case coda_format_ascii:
      product_local._4_4_ = coda_ascii_close(product);
      break;
    case coda_format_binary:
      product_local._4_4_ = coda_bin_close(product);
      break;
    case coda_format_xml:
      product_local._4_4_ = coda_xml_close(product);
      break;
    case coda_format_hdf4:
      coda_set_error(-0xb,(char *)0x0);
      product_local._4_4_ = -1;
      break;
    case coda_format_hdf5:
      coda_set_error(-0xd,(char *)0x0);
      product_local._4_4_ = -1;
      break;
    case coda_format_cdf:
      product_local._4_4_ = coda_cdf_close(product);
      break;
    case coda_format_netcdf:
      product_local._4_4_ = coda_netcdf_close(product);
      break;
    case coda_format_grib:
      product_local._4_4_ = coda_grib_close(product);
      break;
    case coda_format_rinex:
      product_local._4_4_ = coda_rinex_close(product);
      break;
    case coda_format_sp3:
      product_local._4_4_ = coda_sp3_close(product);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                    ,0x341,"int coda_close(coda_product *)");
    }
  }
  return product_local._4_4_;
}

Assistant:

LIBCODA_API int coda_close(coda_product *product)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    /* remove product variable information */
    if (product->product_variable_size != NULL)
    {
        free(product->product_variable_size);
        product->product_variable_size = NULL;
    }
    if (product->product_variable != NULL)
    {
        int i;

        for (i = 0; i < product->product_definition->num_product_variables; i++)
        {
            if (product->product_variable[i] != NULL)
            {
                free(product->product_variable[i]);
            }
        }
        free(product->product_variable);
        product->product_variable = NULL;
    }

    switch (product->format)
    {
        case coda_format_ascii:
            return coda_ascii_close(product);
        case coda_format_binary:
            return coda_bin_close(product);
        case coda_format_xml:
            return coda_xml_close(product);
        case coda_format_cdf:
            return coda_cdf_close(product);
        case coda_format_netcdf:
            return coda_netcdf_close(product);
        case coda_format_grib:
            return coda_grib_close(product);
        case coda_format_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_close(product);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_format_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_close(product);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_format_rinex:
            return coda_rinex_close(product);
        case coda_format_sp3:
            return coda_sp3_close(product);
    }

    assert(0);
    exit(1);
}